

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

char * Gia_DeriveFormula(Gia_Man_t *pGia,char **ppNamesIn)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Vec_Str_t *vStr;
  char *pcVar4;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar5;
  size_t sVar6;
  
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  vStr->nSize = 0;
  pcVar4 = (char *)malloc(1000);
  vStr->pArray = pcVar4;
  p = Gia_ManDupMuxes(pGia,2);
  if (pGia->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar3 = *pGia->vCos->pArray;
  if (((long)iVar3 < 0) || (pGia->nObjs <= iVar3)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar5 = pGia->pObjs + iVar3;
  uVar1 = vStr->nCap;
  if (vStr->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar6 = 0x10;
    }
    else {
      sVar6 = (ulong)uVar1 * 2;
      if ((int)sVar6 <= (int)uVar1) goto LAB_00589e89;
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar6);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,sVar6);
      }
    }
    vStr->pArray = pcVar4;
    vStr->nCap = (int)sVar6;
  }
LAB_00589e89:
  iVar3 = vStr->nSize;
  vStr->nSize = iVar3 + 1;
  vStr->pArray[iVar3] = '(';
  pGVar2 = pGia->pObjs;
  if ((pGVar5 < pGVar2) || (pGVar2 + pGia->nObjs <= pGVar5)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar3 = (int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2) * -0x55555555 -
          (*(uint *)pGVar5 & 0x1fffffff);
  if (iVar3 < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,(*(uint *)pGVar5 >> 0x1d & 1) + iVar3 * 2);
  uVar1 = vStr->nCap;
  if (vStr->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar6 = 0x10;
    }
    else {
      sVar6 = (ulong)uVar1 * 2;
      if ((int)sVar6 <= (int)uVar1) goto LAB_00589f56;
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar6);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,sVar6);
      }
    }
    vStr->pArray = pcVar4;
    vStr->nCap = (int)sVar6;
  }
LAB_00589f56:
  iVar3 = vStr->nSize;
  vStr->nSize = iVar3 + 1;
  vStr->pArray[iVar3] = ')';
  uVar1 = vStr->nCap;
  if (vStr->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar6 = 0x10;
    }
    else {
      sVar6 = (ulong)uVar1 * 2;
      if ((int)sVar6 <= (int)uVar1) goto LAB_00589fc5;
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar6);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,sVar6);
      }
    }
    vStr->pArray = pcVar4;
    vStr->nCap = (int)sVar6;
  }
LAB_00589fc5:
  iVar3 = vStr->nSize;
  vStr->nSize = iVar3 + 1;
  vStr->pArray[iVar3] = '\0';
  Gia_ManStop(p);
  pcVar4 = vStr->pArray;
  vStr->nCap = 0;
  vStr->nSize = 0;
  vStr->pArray = (char *)0x0;
  if (vStr->pArray != (char *)0x0) {
    free(vStr->pArray);
    vStr->pArray = (char *)0x0;
  }
  free(vStr);
  return pcVar4;
}

Assistant:

char * Gia_DeriveFormula( Gia_Man_t * pGia, char ** ppNamesIn )
{
    char * pResult;
    Vec_Str_t * vStr   = Vec_StrAlloc( 1000 );
    Gia_Man_t * pMuxes = Gia_ManDupMuxes( pGia, 2 );
    Gia_Obj_t * pObj   = Gia_ManCo( pGia, 0 );
    Vec_StrPush( vStr, '(' );
    Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Gia_ObjFaninLit0p(pGia, pObj) );
    Vec_StrPush( vStr, ')' );
    Vec_StrPush( vStr, '\0' );
    Gia_ManStop( pMuxes );
    pResult = Vec_StrReleaseArray( vStr );
    Vec_StrFree( vStr );
    return pResult;
}